

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array.cpp
# Opt level: O1

bool __thiscall ON_UuidIndexList::RemoveUuid(ON_UuidIndexList *this,ON_UUID uuid)

{
  ON_UuidIndex *pOVar1;
  uint uVar2;
  ON_UUID local_18;
  
  local_18.Data4 = uuid.Data4;
  local_18._0_8_ = uuid._0_8_;
  pOVar1 = SearchHelper(this,&local_18);
  if (pOVar1 != (ON_UuidIndex *)0x0) {
    (pOVar1->m_id).Data1 = 0xffffffff;
    (pOVar1->m_id).Data2 = 0xffff;
    (pOVar1->m_id).Data3 = 0xffff;
    (pOVar1->m_id).Data4[0] = 0xff;
    (pOVar1->m_id).Data4[1] = 0xff;
    (pOVar1->m_id).Data4[2] = 0xff;
    (pOVar1->m_id).Data4[3] = 0xff;
    (pOVar1->m_id).Data4[4] = 0xff;
    (pOVar1->m_id).Data4[5] = 0xff;
    (pOVar1->m_id).Data4[6] = 0xff;
    (pOVar1->m_id).Data4[7] = 0xff;
    this->m_removed_count = this->m_removed_count + 1;
    uVar2 = (int)((ulong)((long)pOVar1 - (long)(this->super_ON_SimpleArray<ON_UuidIndex>).m_a) >> 2)
            * -0x33333333;
    if (uVar2 < this->m_sorted_count) {
      this->m_sorted_count = uVar2;
    }
  }
  return pOVar1 != (ON_UuidIndex *)0x0;
}

Assistant:

bool ON_UuidIndexList::RemoveUuid(ON_UUID uuid)
{
  ON_UuidIndex* p = SearchHelper(&uuid);
  if ( 0 != p )
  {
    p->m_id = ON_max_uuid;
    m_removed_count++;
    unsigned int i = (unsigned int)(p - m_a);
    if ( i < m_sorted_count )
      m_sorted_count = i;
  }
  return (0!=p);
}